

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_close(void *arg)

{
  udp_ep *ep_00;
  nni_aio *aio_00;
  nni_aio *aio;
  udp_ep *ep;
  udp_pipe *p;
  void *arg_local;
  
  ep_00 = *arg;
  nni_mtx_lock(&ep_00->mtx);
  udp_send_disc(ep_00,(udp_pipe *)arg,DISC_CLOSED);
  while( true ) {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x128));
    if (aio_00 == (nni_aio *)0x0) break;
    nni_aio_list_remove(aio_00);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  nni_mtx_unlock(&ep_00->mtx);
  return;
}

Assistant:

static void
udp_pipe_close(void *arg)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;
	nni_aio  *aio;

	nni_mtx_lock(&ep->mtx);
	udp_send_disc(ep, p, DISC_CLOSED);
	while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&ep->mtx);
}